

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzgeoelrefless.h.h
# Opt level: O0

void __thiscall
TPZGeoElRefLess<pzgeom::TPZQuadraticLine>::X
          (TPZGeoElRefLess<pzgeom::TPZQuadraticLine> *this,TPZVec<Fad<double>_> *coordinate,
          TPZVec<Fad<double>_> *result)

{
  long *in_RDX;
  TPZFNMatrix<54,_double> cornerco;
  int64_t in_stack_fffffffffffffd90;
  TPZFMatrix<double> *in_stack_fffffffffffffd98;
  TPZFNMatrix<54,_double> *in_stack_fffffffffffffda0;
  
  (**(code **)(*in_RDX + 0x18))();
  TPZFNMatrix<54,_double>::TPZFNMatrix
            (in_stack_fffffffffffffda0,(int64_t)in_stack_fffffffffffffd98,in_stack_fffffffffffffd90)
  ;
  CornerCoordinates((TPZGeoElRefLess<pzgeom::TPZQuadraticLine> *)in_stack_fffffffffffffda0,
                    in_stack_fffffffffffffd98);
  pzgeom::TPZQuadraticLine::X<Fad<double>>
            ((TPZFMatrix<double> *)result,(TPZVec<Fad<double>_> *)cornerco.fBuf[0x36],
             (TPZVec<Fad<double>_> *)cornerco.fBuf[0x35]);
  TPZFNMatrix<54,_double>::~TPZFNMatrix((TPZFNMatrix<54,_double> *)0x1809ec3);
  return;
}

Assistant:

void
TPZGeoElRefLess<TGeo>::X(TPZVec<Fad<REAL> > &coordinate,TPZVec<Fad<REAL> > &result) const {
    result.Resize(3);
    TPZFNMatrix<54,REAL> cornerco(3,fGeo.NNodes);
    CornerCoordinates(cornerco);
    fGeo.X(cornerco,coordinate,result);
}